

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.h
# Opt level: O3

void __thiscall Am_Assoc_Data::Am_Assoc_Data(Am_Assoc_Data *this,Am_Value *val1,Am_Value *val2)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e3108;
  (this->value_1).type = 0;
  (this->value_1).value.wrapper_value = (Am_Wrapper *)0x0;
  (this->value_2).type = 0;
  (this->value_2).value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value::operator=(&this->value_1,val1);
  Am_Value::operator=(&this->value_2,val2);
  return;
}

Assistant:

Am_Assoc_Data(const Am_Value &val1, const Am_Value &val2)
  {
    value_1 = val1;
    value_2 = val2;
  }